

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.h
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* cppnet::any_cast<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (Any *operand)

{
  bool bVar1;
  type_info *this;
  Any *operand_local;
  
  if (operand != (Any *)0x0) {
    this = Any::Type(operand);
    bVar1 = std::type_info::operator==
                      (this,(type_info *)
                            &std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                             ::typeinfo);
    if (bVar1) {
      return (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)(operand->_content + 1);
    }
  }
  return (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x0;
}

Assistant:

ValueType* any_cast(Any * operand)  {
    if (operand && operand->Type() == typeid(ValueType)) {
        return &static_cast<Any::CHolder<ValueType> *>(operand->_content)->_held;
    }
    return nullptr;
}